

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bchg_8_r_pi7(void)

{
  uint address;
  uint uVar1;
  byte bVar2;
  
  address = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  uVar1 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  bVar2 = *(byte *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c)) & 7;
  m68ki_cpu.not_z_flag = 1 << bVar2 & uVar1;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,uVar1 ^ 1 << bVar2);
  return;
}

Assistant:

static void m68k_op_bchg_8_r_pi7(void)
{
	uint ea = EA_A7_PI_8();
	uint src = m68ki_read_8(ea);
	uint mask = 1 << (DX & 7);

	FLAG_Z = src & mask;
	m68ki_write_8(ea, src ^ mask);
}